

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
::
ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::ObjHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
           *this)

{
  bool bVar1;
  int obj_index;
  int num_terms;
  ObjHandler lh;
  
  lh.
  super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>::ItemType)1>
  .reader_ = (ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>::ItemType)1>
              )(ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>::ItemType)1>
                )this;
  obj_index = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
              ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
                          *)this,*(uint *)(*(long *)(this + 8) + 8));
  num_terms = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
              ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
                          *)this,1,**(int **)(this + 8) + 1);
  bVar1 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
          ::ObjHandler::SkipExpr(&lh,obj_index);
  if (bVar1) {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
    ::ReadLinearExpr<mp::internal::NullLinearExprHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
                *)this,num_terms);
  }
  else {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
    ::ObjHandler::OnLinearExpr(&lh,obj_index,num_terms);
    ReadLinearExpr<mp::NLHandler<MockNLHandler,BasicTestExpr<0>>::LinearExprHandler>(this,num_terms)
    ;
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}